

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O2

axbStatus_t axbVecPointwiseMult(axbVec_s *w,axbVec_s *x,axbVec_s *y)

{
  axbStatus_t aVar1;
  
  if (((x->init == 0x1d232) && (y->init == 0x1d232)) && (w->init == 0x1d232)) {
    (*w->opBackend->op_table[0x15].func)();
    aVar1 = 0;
  }
  else {
    fwrite("Vector not fully initialized!\n",0x1e,1,_stderr);
    aVar1 = 0x1d232;
  }
  return aVar1;
}

Assistant:

axbStatus_t axbVecPointwiseMult(struct axbVec_s *w, const struct axbVec_s *x, const struct axbVec_s *y)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);
  AXB_VECTOR_INIT_CHECK(w);

  axbOpDescriptor_t op_desc = w->opBackend->op_table[AXB_OP_VEC_POINTWISEMULT];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbVec_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbVec_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(w, x, y, op_desc.func_data);
  return 0;
}